

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputSetInfo(HelicsInput inp,char *info,HelicsError *err)

{
  string_view info_00;
  InputObject *pIVar1;
  long in_RSI;
  __sv_type _Var2;
  InputObject *inpObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  Interface *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput
                     (in_stack_ffffffffffffffc8,(HelicsError *)in_stack_ffffffffffffffc0);
  if (pIVar1 != (InputObject *)0x0) {
    if (in_RSI == 0) {
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffd0 = (Interface *)_Var2._M_len;
      in_stack_ffffffffffffffd8 = _Var2._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
    }
    info_00._M_str = (char *)pIVar1;
    info_00._M_len = (size_t)in_stack_ffffffffffffffd8;
    helics::Interface::setInfo(in_stack_ffffffffffffffd0,info_00);
  }
  return;
}

Assistant:

void helicsInputSetInfo(HelicsInput inp, const char* info, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        inpObj->inputPtr->setInfo(AS_STRING_VIEW(info));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}